

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O2

void __thiscall ClassBundle::updateField(ClassBundle *this,Field *field)

{
  FieldType type;
  FieldType local_70;
  string local_38;
  
  FieldType::FieldType(&local_70,&field->type);
  updateFieldType(this,&local_70);
  FieldType::getName_abi_cxx11_(&local_38,&local_70);
  std::__cxx11::string::operator=((string *)field,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  FieldType::~FieldType(&local_70);
  return;
}

Assistant:

void updateField(Field &field) {
        FieldType type(field.type);
//        type.Debug();

        this->updateFieldType(type);

        field.type = type.getName();
    }